

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O1

void __thiscall DataSet::shuffle(DataSet *this)

{
  uint uVar1;
  uint row2;
  int iVar2;
  uint uVar3;
  time_t tVar4;
  uint row1;
  
  row1 = 0;
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  uVar1 = (this->m_matrix).m_shape.n_row;
  if (uVar1 != 0) {
    do {
      iVar2 = rand();
      uVar3 = (uint)(((double)iVar2 / 2147483647.0) * (double)uVar1);
      row2 = -uVar3;
      if (0 < (int)uVar3) {
        row2 = uVar3;
      }
      Matrix<double>::swap(&this->m_matrix,row1,row2);
      row1 = row1 + 1;
    } while (uVar1 != row1);
  }
  return;
}

Assistant:

void DataSet::shuffle(){
    srand(time(0));

    unsigned prev, next;
    unsigned n_row=m_matrix.shape().n_row;
    for(unsigned i=0;i<n_row;++i){
        prev=i;
        next=abs((rand()/(double)RAND_MAX)*n_row);
        m_matrix.swap(prev, next);
    }
}